

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O2

void h_cb(Fl_Value_Input *i,void *v)

{
  Fl_Type *pFVar1;
  Fl_Window *this;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Fl_Window *pFVar9;
  Fl_Type **ppFVar10;
  
  if ((char *)v == "LOAD") {
    h_input = i;
    iVar5 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x17])();
    if (iVar5 != 0) {
      Fl_Valuator::value(&i->super_Fl_Valuator,(double)current_widget->o->h_);
      Fl_Widget::activate((Fl_Widget *)h_input);
      return;
    }
    Fl_Widget::deactivate((Fl_Widget *)h_input);
    return;
  }
  bVar2 = false;
  ppFVar10 = &Fl_Type::first;
  while (pFVar1 = *ppFVar10, pFVar1 != (Fl_Type *)0x0) {
    if (pFVar1->selected != '\0') {
      iVar5 = (*pFVar1->_vptr_Fl_Type[0x17])(pFVar1);
      if (iVar5 != 0) {
        this = (Fl_Window *)pFVar1[1].prev;
        (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[4])
                  (this,(ulong)(uint)(this->super_Fl_Group).super_Fl_Widget.x_,
                   (ulong)(uint)(this->super_Fl_Group).super_Fl_Widget.y_,
                   (ulong)(uint)(this->super_Fl_Group).super_Fl_Widget.w_,
                   (ulong)(uint)(int)(i->super_Fl_Valuator).value_);
        pFVar9 = Fl_Widget::window((Fl_Widget *)this);
        if (pFVar9 != (Fl_Window *)0x0) {
          pFVar9 = Fl_Widget::window((Fl_Widget *)this);
          Fl_Widget::redraw((Fl_Widget *)pFVar9);
        }
        iVar6 = (*pFVar1->_vptr_Fl_Type[0x21])(pFVar1);
        iVar3 = gridy;
        iVar5 = gridx;
        bVar2 = true;
        if (iVar6 != 0) {
          iVar7 = Fl::w();
          iVar8 = Fl::h();
          iVar4 = gridy;
          iVar6 = gridx;
          this->minw = iVar5;
          this->minh = iVar3;
          bVar2 = true;
          this->maxw = iVar7;
          this->maxh = iVar8;
          this->dw = iVar6;
          this->dh = iVar4;
          this->aspect = 0;
          Fl_Window::size_range_(this);
        }
      }
    }
    ppFVar10 = &pFVar1->next;
  }
  if (bVar2) {
    set_modflag(1);
    return;
  }
  return;
}

Assistant:

void h_cb(Fl_Value_Input *i, void *v) {
  if (v == LOAD) {
    h_input = i;
    if (current_widget->is_widget()) {
      i->value(((Fl_Widget_Type *)current_widget)->o->h());
      h_input->activate();
    } else h_input->deactivate();
  } else {
    int mod = 0;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
        Fl_Widget *w = ((Fl_Widget_Type *)o)->o;
	w->resize(w->x(), w->y(), w->w(), (int)i->value());
	if (w->window()) w->window()->redraw();
	if (o->is_window()) {
          ((Fl_Window *)w)->size_range(gridx, gridy, Fl::w(), Fl::h(),
                                       gridx, gridy, 0);
	}
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
}